

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_add_slow(JSContext *ctx,JSValue *sp)

{
  JSValue *pJVar1;
  JSValue *pJVar2;
  int *piVar3;
  double dVar4;
  JSValue JVar5;
  JSValueUnion JVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  JSRuntime *rt;
  ulong uVar10;
  JSValueUnion JVar11;
  uint32_t tag;
  uint32_t tag_1;
  uint uVar12;
  anon_union_8_2_94730072 u;
  JSValue op1;
  JSValue op2;
  JSValue JVar13;
  double d2;
  double d1;
  JSValueUnion local_40;
  JSValueUnion local_38;
  
  pJVar1 = sp + -2;
  pJVar2 = sp + -1;
  piVar3 = (int *)(pJVar2->u).ptr;
  JVar5 = *pJVar2;
  JVar13 = *pJVar2;
  iVar7 = (int)sp[-2].tag;
  uVar12 = (uint)sp[-1].tag;
  if (((iVar7 == 7) || (iVar7 == 0)) &&
     ((op1 = *pJVar1, op2 = *pJVar2, uVar12 == 0 || (op1 = *pJVar1, op2 = *pJVar2, uVar12 == 7)))) {
LAB_0013aa66:
    JVar11 = op2.u;
    uVar12 = (uint)op2.tag;
    if ((uint)op1.tag < 3) {
      JVar6.float64 = (double)op1.u._0_4_;
    }
    else {
      JVar6 = op1.u;
      if (((uint)op1.tag != 7) &&
         (iVar7 = __JS_ToFloat64Free(ctx,&local_38.float64,op1), JVar6 = local_38, iVar7 != 0)) {
        if ((uVar12 < 0xfffffff5) ||
           (iVar7 = *JVar11.ptr, *(int *)JVar11.ptr = iVar7 + -1, 1 < iVar7)) goto LAB_0013ab86;
        rt = ctx->rt;
        goto LAB_0013aacc;
      }
    }
    local_38 = JVar6;
    if (uVar12 < 3) {
      JVar11.float64 = (double)op2.u._0_4_;
    }
    else if ((uVar12 != 7) &&
            (iVar7 = __JS_ToFloat64Free(ctx,&local_40.float64,op2), JVar11 = local_40, iVar7 != 0))
    goto LAB_0013ab86;
    local_40 = JVar11;
    dVar4 = local_38.float64 + local_40.float64;
    uVar9 = (ulong)dVar4 & 0xffffffff;
    uVar10 = (ulong)dVar4 & 0xffffffff00000000;
    if (dVar4 == (double)(int)dVar4) {
      uVar9 = (ulong)(uint)(int)dVar4;
      uVar10 = 0;
    }
    uVar8 = 7;
    if (dVar4 == (double)(int)dVar4) {
      uVar8 = 0;
    }
    sp[-2].u.ptr = (void *)(uVar9 | uVar10);
    sp[-2].tag = uVar8;
    return 0;
  }
  op1 = JS_ToPrimitiveFree(ctx,*pJVar1,2);
  if ((op1.tag & 0xffffffffU) == 6) {
    if ((uVar12 < 0xfffffff5) || (iVar7 = *piVar3, *piVar3 = iVar7 + -1, 1 < iVar7))
    goto LAB_0013ab86;
    rt = ctx->rt;
    op2 = JVar5;
  }
  else {
    op2 = JS_ToPrimitiveFree(ctx,JVar13,2);
    if ((op2.tag & 0xffffffffU) != 6) {
      if (((uint)op1.tag == 0xfffffff9) || ((int)op2.tag == -7)) {
        JVar13 = JS_ConcatString(ctx,op1,op2);
        sp[-2] = JVar13;
        if ((int)JVar13.tag != 6) {
          return 0;
        }
        goto LAB_0013ab86;
      }
      goto LAB_0013aa66;
    }
    if (((uint)op1.tag < 0xfffffff5) ||
       (iVar7 = *op1.u.ptr, *(int *)op1.u.ptr = iVar7 + -1, 1 < iVar7)) goto LAB_0013ab86;
    rt = ctx->rt;
    op2 = op1;
  }
LAB_0013aacc:
  __JS_FreeValueRT(rt,op2);
LAB_0013ab86:
  sp[-2].u.int32 = 0;
  sp[-2].tag = 3;
  sp[-1].u.int32 = 0;
  sp[-1].tag = 3;
  return -1;
}

Assistant:

int js_add_slow(JSContext *ctx, JSValue *sp)
{
    JSValue op1, op2;
    uint32_t tag1, tag2;

    op1 = sp[-2];
    op2 = sp[-1];
    tag1 = JS_VALUE_GET_TAG(op1);
    tag2 = JS_VALUE_GET_TAG(op2);
    if ((tag1 == JS_TAG_INT || JS_TAG_IS_FLOAT64(tag1)) &&
        (tag2 == JS_TAG_INT || JS_TAG_IS_FLOAT64(tag2))) {
        goto add_numbers;
    } else {
        op1 = JS_ToPrimitiveFree(ctx, op1, HINT_NONE);
        if (JS_IsException(op1)) {
            JS_FreeValue(ctx, op2);
            goto exception;
        }
        op2 = JS_ToPrimitiveFree(ctx, op2, HINT_NONE);
        if (JS_IsException(op2)) {
            JS_FreeValue(ctx, op1);
            goto exception;
        }
        tag1 = JS_VALUE_GET_TAG(op1);
        tag2 = JS_VALUE_GET_TAG(op2);
        if (tag1 == JS_TAG_STRING || tag2 == JS_TAG_STRING) {
            sp[-2] = JS_ConcatString(ctx, op1, op2);
            if (JS_IsException(sp[-2]))
                goto exception;
        } else {
            double d1, d2;
        add_numbers:
            if (JS_ToFloat64Free(ctx, &d1, op1)) {
                JS_FreeValue(ctx, op2);
                goto exception;
            }
            if (JS_ToFloat64Free(ctx, &d2, op2))
                goto exception;
            sp[-2] = JS_NewFloat64(ctx, d1 + d2);
        }
    }
    return 0;
 exception:
    sp[-2] = JS_UNDEFINED;
    sp[-1] = JS_UNDEFINED;
    return -1;
}